

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_perms.c
# Opt level: O1

void searchgid(void)

{
  long lVar1;
  __uid_t __owner;
  int __fd;
  int iVar2;
  __gid_t _Var3;
  long lVar4;
  stat_conflict st;
  stat local_b0;
  
  __owner = getuid();
  if (searchgid__searched != '\0') {
    return;
  }
  searchgid__searched = 1;
  __fd = open("test_gid",0x40,0x1b4);
  failure("Couldn\'t create a file for gid testing.");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'@',(uint)(0 < __fd),"fd > 0",(void *)0x0);
  iVar2 = fstat(__fd,&local_b0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_perms.c"
                   ,L'C',(uint)(iVar2 == 0),"fstat(fd, &st) == 0",(void *)0x0);
  _default_gid = (long)local_b0.st_gid;
  _invalid_gid = -1;
  lVar4 = 1;
  do {
    _Var3 = (__gid_t)lVar4;
    iVar2 = fchown(__fd,__owner,_Var3);
    lVar1 = lVar4;
    if (iVar2 != 0) break;
    lVar4 = lVar4 + 1;
    lVar1 = _invalid_gid;
  } while (_Var3 < 9999);
  _invalid_gid = lVar1;
  _alt_gid = -1;
  lVar4 = 0;
  do {
    _Var3 = (__gid_t)lVar4;
    if ((_Var3 != (__gid_t)_default_gid) &&
       (iVar2 = fchown(__fd,__owner,_Var3), lVar1 = lVar4, iVar2 == 0)) break;
    lVar4 = lVar4 + 1;
    lVar1 = _alt_gid;
  } while (_Var3 < 9999);
  _alt_gid = lVar1;
  close(__fd);
  return;
}

Assistant:

static void
searchgid(void)
{
	static int   _searched = 0;
	uid_t uid = getuid();
	gid_t gid = 0;
	unsigned int n;
	struct stat st;
	int fd;

	/* If we've already looked this up, we're done. */
	if (_searched)
		return;
	_searched = 1;

	/* Create a file on disk in the current default dir. */
	fd = open("test_gid", O_CREAT | O_BINARY, 0664);
	failure("Couldn't create a file for gid testing.");
	assert(fd > 0);

	/* See what GID it ended up with.  This is our "valid" GID. */
	assert(fstat(fd, &st) == 0);
	_default_gid = st.st_gid;

	/* Find a GID for which fchown() fails.  This is our "invalid" GID. */
	_invalid_gid = -1;
	/* This loop stops when we wrap the gid or examine 10,000 gids. */
	for (gid = 1, n = 1; gid == n && n < 10000 ; n++, gid++) {
		if (fchown(fd, uid, gid) != 0) {
			_invalid_gid = gid;
			break;
		}
	}

	/*
	 * Find a GID for which fchown() succeeds, but which isn't the
	 * default.  This is the "alternate" gid.
	 */
	_alt_gid = -1;
	for (gid = 0, n = 0; gid == n && n < 10000 ; n++, gid++) {
		/* _alt_gid must be different than _default_gid */
		if (gid == (gid_t)_default_gid)
			continue;
		if (fchown(fd, uid, gid) == 0) {
			_alt_gid = gid;
			break;
		}
	}
	close(fd);
}